

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.c
# Opt level: O2

int main(int argc,char **argv)

{
  rnnvalue *prVar1;
  bool bVar2;
  int iVar3;
  rnndb *db;
  rnndeccontext *ctx;
  ulonglong addr;
  ulonglong value;
  rnnenum *prVar4;
  rnndomain *domain;
  rnndecaddrinfo *a;
  rnnbitset *prVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  int local_5c;
  char *local_50;
  char *local_48;
  ulonglong local_40;
  
  local_40 = 0;
  rnn_init();
  if (1 < argc) {
    db = rnn_newdb();
    pcVar9 = "root.xml";
    local_50 = "NV_MMIO";
    bVar2 = false;
    local_48 = (char *)0x0;
    local_5c = 100;
    do {
      iVar3 = getopt(argc,argv,"f:a:d:e:b:c");
      switch(iVar3) {
      case 0x61:
        local_40 = strtoull(_optarg,(char **)0x0,0x10);
        if ((int)local_40 == 0) {
          local_48 = strdup(_optarg);
          local_40 = 0;
        }
        else {
          free(local_48);
          local_48 = (char *)0x0;
        }
        break;
      case 0x62:
      case 100:
      case 0x65:
        local_50 = strdup(_optarg);
        local_5c = iVar3;
        break;
      case 99:
        bVar2 = true;
        break;
      case 0x66:
        pcVar9 = strdup(_optarg);
        break;
      default:
        goto switchD_001023d7_default;
      }
    } while( true );
  }
LAB_001026fa:
  usage();
  xmlCheckVersion(0x51b1);
  iVar3 = xmlInitParser();
  return iVar3;
switchD_001023d7_default:
  if (iVar3 != -1) goto LAB_001026fa;
  rnn_parsefile(db,pcVar9);
  rnn_prepdb(db);
  ctx = rnndec_newcontext(db);
  if (!bVar2) {
    ctx->colors = &envy_def_colors;
  }
  if (local_48 == (char *)0x0) {
    if ((int)local_40 != 0) {
      rnndec_varaddvalue(ctx,"chipset",(long)(int)local_40);
    }
  }
  else {
    rnndec_varadd(ctx,"chipset",local_48);
  }
  while( true ) {
    lVar6 = (long)_optind;
    pcVar9 = argv[lVar6];
    if (((*pcVar9 != '-') || (pcVar9[1] != 'v')) || (pcVar9[2] != '\0')) break;
    rnndec_varadd(ctx,argv[lVar6 + 1],argv[lVar6 + 2]);
    _optind = _optind + 3;
  }
  if (argc <= _optind) {
    fwrite("No address specified.\n",0x16,1,_stderr);
    return 1;
  }
  value = 0;
  addr = strtoull(pcVar9,(char **)0x0,0x10);
  if (_optind + 1 < argc) {
    value = strtoull(argv[(long)_optind + 1],(char **)0x0,0x10);
  }
  iVar3 = 1;
  if (local_5c == 0x62) {
    prVar5 = rnn_findbitset(db,local_50);
    if (prVar5 != (rnnbitset *)0x0) {
      pcVar9 = "TODO";
LAB_0010264c:
      puts(pcVar9);
LAB_00102651:
      iVar3 = 0;
      goto LAB_00102653;
    }
    pcVar9 = "Not a bitset: \'%s\'\n";
  }
  else if (local_5c == 100) {
    domain = rnn_finddomain(db,local_50);
    if (domain != (rnndomain *)0x0) {
      a = rnndec_decodeaddr(ctx,domain,addr,0);
      if (a == (rnndecaddrinfo *)0x0) goto LAB_00102653;
      if (a->typeinfo != (rnntypeinfo *)0x0) {
        pcVar9 = rnndec_decodeval(ctx,a->typeinfo,value,a->width);
        iVar3 = 0;
        printf("%s => %s\n",a->name,pcVar9);
        free(pcVar9);
        rnndec_free_decaddrinfo(a);
        goto LAB_00102653;
      }
      puts(a->name);
      rnndec_free_decaddrinfo(a);
      goto LAB_00102651;
    }
    pcVar9 = "Not a domain: \'%s\'\n";
  }
  else {
    if (local_5c != 0x65) goto LAB_00102653;
    prVar4 = rnn_findenum(db,local_50);
    if (prVar4 != (rnnenum *)0x0) {
      uVar8 = 0;
      uVar7 = (ulong)(uint)prVar4->valsnum;
      if (prVar4->valsnum < 1) {
        uVar7 = uVar8;
      }
      for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        prVar1 = prVar4->vals[uVar8];
        if ((prVar1->valvalid != 0) && (prVar1->value == addr)) {
          pcVar9 = prVar1->name;
          goto LAB_0010264c;
        }
      }
      iVar3 = 0;
      printf("%#lx\n",addr);
      goto LAB_00102653;
    }
    pcVar9 = "Not an enum: \'%s\'\n";
  }
  fprintf(_stderr,pcVar9,local_50);
LAB_00102653:
  rnndec_freecontext(ctx);
  rnn_freedb(db);
  rnn_fini();
  return iVar3;
}

Assistant:

int main(int argc, char **argv) {
	char *file = "root.xml";
	char *name = "NV_MMIO";
	char *variant = NULL;
	int c, mode = 'd', chip = 0;
	uint64_t reg, colors=1, val = 0;
	struct rnndeccontext *vc;
	int ret;

	rnn_init();
	if (argc < 2) {
		usage();
	}
	struct rnndb *db = rnn_newdb();

	/* Arguments parsing */
	while ((c = getopt (argc, argv, "f:a:d:e:b:c")) != -1) {
		switch (c) {
			case 'f':
				file = strdup(optarg);
				break;
			case 'e':
				mode = 'e';
				name = strdup(optarg);
				break;
			case 'b':
				mode = 'b';
				name = strdup(optarg);
				break;
			case 'd':
				mode = 'd';
				name = strdup(optarg);
				break;
			case 'a':
				chip = strtoull(optarg, NULL, 16);
				if (!chip)
					variant = strdup(optarg);
				else {
					free(variant);
					variant = NULL;
				}
				break;
			case 'c':
				colors = 0;
				break;
			default: usage();
		}
	}

	rnn_parsefile (db, file);
	rnn_prepdb (db);
	vc = rnndec_newcontext(db);
	if(colors)
		vc->colors = &envy_def_colors;

	if (variant)
		rnndec_varadd(vc, "chipset", variant);
	else if (chip)
		rnndec_varaddvalue(vc, "chipset",  chip);

	/* Parse extra arguments */
	while (!strcmp (argv[optind], "-v")) {
		rnndec_varadd(vc, argv[optind+1], argv[optind+2]);
		optind+=3;
	}

	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}

	reg = strtoull(argv[optind], 0, 16);
	if (optind + 1 < argc)
		val = strtoull(argv[optind + 1], 0, 16);

	if (mode == 'e') {
		struct rnnenum *en = rnn_findenum (db, name);
		if (en) {
			int i;
			int dec = 0;
			for (i = 0; i < en->valsnum; i++)
				if (en->vals[i]->valvalid && en->vals[i]->value == reg) {
					printf ("%s\n", en->vals[i]->name);
					dec = 1;
					break;
				}
			if (!dec)
				printf ("%#"PRIx64"\n", reg);

			ret = 0;
		} else {
			fprintf(stderr, "Not an enum: '%s'\n", name);
			ret = 1;
		}
	} else if (mode == 'b') {
		struct rnnbitset *bs = rnn_findbitset (db, name);

		if (bs) {
			printf("TODO\n");
			ret = 0;
		} else {
			fprintf(stderr, "Not a bitset: '%s'\n", name);
			ret = 1;
		}

	} else if (mode == 'd') {
		struct rnndomain *dom = rnn_finddomain (db, name);

		if (dom) {
			struct rnndecaddrinfo *info = rnndec_decodeaddr(vc, dom, reg, 0);
			if (info && info->typeinfo) {
				char *res = rnndec_decodeval(vc, info->typeinfo, val, info->width);
				printf ("%s => %s\n", info->name, res);
				free(res);
				rnndec_free_decaddrinfo(info);
				ret = 0;
			} else if (info) {
				printf ("%s\n", info->name);
				rnndec_free_decaddrinfo(info);
				ret = 0;
			} else
				ret = 1;
		} else {
			fprintf(stderr, "Not a domain: '%s'\n", name);
			ret = 1;
		}
	} else {
		ret = 1;
	}

	rnndec_freecontext(vc);
	rnn_freedb(db);
	rnn_fini();

	return ret;
}